

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseAccessor(Accessor *accessor,string *err,json *o)

{
  json *pjVar1;
  bool bVar2;
  int iVar3;
  size_type *ret;
  string *psVar4;
  ostream *poVar5;
  json *pjVar6;
  undefined1 local_6b0 [8];
  json_const_iterator iterator;
  stringstream local_670 [8];
  stringstream ss_1;
  ostream local_660 [383];
  allocator local_4e1;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  string local_448;
  allocator local_421;
  string local_420;
  string local_400 [32];
  stringstream local_3e0 [8];
  stringstream ss;
  ostream local_3d0 [376];
  undefined4 local_258;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  undefined1 local_208 [8];
  string type;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  size_t local_198;
  size_t count;
  string local_188;
  allocator local_161;
  string local_160;
  size_t local_140;
  size_t componentType;
  string local_130;
  allocator local_109;
  string local_108;
  bool local_e2;
  allocator local_e1;
  undefined1 local_e0 [6];
  bool normalized;
  allocator local_b9;
  string local_b8;
  size_t local_98;
  size_t byteOffset;
  string local_88;
  allocator local_51;
  string local_50;
  int local_2c;
  json *pjStack_28;
  int bufferView;
  json *o_local;
  string *err_local;
  Accessor *accessor_local;
  
  local_2c = -1;
  pjStack_28 = o;
  o_local = (json *)err;
  err_local = (string *)accessor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"bufferView",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"Accessor",(allocator *)((long)&byteOffset + 7));
  ParseIntegerProperty(&local_2c,err,o,&local_50,false,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&byteOffset + 7));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pjVar6 = o_local;
  pjVar1 = pjStack_28;
  local_98 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"byteOffset",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_e0,"Accessor",&local_e1);
  ParseUnsignedProperty(&local_98,(string *)pjVar6,pjVar1,&local_b8,false,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pjVar6 = o_local;
  pjVar1 = pjStack_28;
  local_e2 = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"normalized",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_130,"Accessor",(allocator *)((long)&componentType + 7));
  ParseBooleanProperty(&local_e2,(string *)pjVar6,pjVar1,&local_108,false,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&componentType + 7));
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pjVar6 = o_local;
  pjVar1 = pjStack_28;
  local_140 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"componentType",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"Accessor",(allocator *)((long)&count + 7));
  bVar2 = ParseUnsignedProperty(&local_140,(string *)pjVar6,pjVar1,&local_160,true,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&count + 7));
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  pjVar6 = o_local;
  pjVar1 = pjStack_28;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    accessor_local._7_1_ = 0;
    goto LAB_00535d2c;
  }
  local_198 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"count",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e0,"Accessor",(allocator *)(type.field_2._M_local_buf + 0xf));
  bVar2 = ParseUnsignedProperty(&local_198,(string *)pjVar6,pjVar1,&local_1b8,true,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)(type.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    accessor_local._7_1_ = 0;
    goto LAB_00535d2c;
  }
  std::__cxx11::string::string((string *)local_208);
  pjVar6 = o_local;
  pjVar1 = pjStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"type",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"Accessor",&local_251);
  bVar2 = ParseStringProperty((string *)local_208,(string *)pjVar6,pjVar1,&local_228,true,&local_250
                             );
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    iVar3 = std::__cxx11::string::compare(local_208);
    if (iVar3 == 0) {
      *(undefined4 *)(err_local + 2) = 0x41;
    }
    else {
      iVar3 = std::__cxx11::string::compare(local_208);
      if (iVar3 == 0) {
        *(undefined4 *)(err_local + 2) = 2;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_208);
        if (iVar3 == 0) {
          *(undefined4 *)(err_local + 2) = 3;
        }
        else {
          iVar3 = std::__cxx11::string::compare(local_208);
          if (iVar3 == 0) {
            *(undefined4 *)(err_local + 2) = 4;
          }
          else {
            iVar3 = std::__cxx11::string::compare(local_208);
            if (iVar3 == 0) {
              *(undefined4 *)(err_local + 2) = 0x22;
            }
            else {
              iVar3 = std::__cxx11::string::compare(local_208);
              if (iVar3 == 0) {
                *(undefined4 *)(err_local + 2) = 0x23;
              }
              else {
                iVar3 = std::__cxx11::string::compare(local_208);
                if (iVar3 != 0) {
                  std::__cxx11::stringstream::stringstream(local_3e0);
                  poVar5 = std::operator<<(local_3d0,
                                           "Unsupported `type` for accessor object. Got \"");
                  poVar5 = std::operator<<(poVar5,(string *)local_208);
                  std::operator<<(poVar5,"\"\n");
                  if (o_local != (json *)0x0) {
                    std::__cxx11::stringstream::str();
                    std::__cxx11::string::operator+=((string *)o_local,local_400);
                    std::__cxx11::string::~string(local_400);
                  }
                  accessor_local._7_1_ = 0;
                  local_258 = 1;
                  std::__cxx11::stringstream::~stringstream(local_3e0);
                  goto LAB_00535d10;
                }
                *(undefined4 *)(err_local + 2) = 0x24;
              }
            }
          }
        }
      }
    }
    pjVar6 = o_local;
    pjVar1 = pjStack_28;
    ret = &err_local->_M_string_length;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"name",&local_421);
    std::__cxx11::string::string((string *)&local_448);
    ParseStringProperty((string *)ret,(string *)pjVar6,pjVar1,&local_420,false,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)(err_local + 7));
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)((long)&err_local[7].field_2 + 8));
    pjVar6 = o_local;
    pjVar1 = pjStack_28;
    psVar4 = err_local + 7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,"min",&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"Accessor",&local_491);
    ParseNumberArrayProperty
              ((vector<double,_std::allocator<double>_> *)psVar4,(string *)pjVar6,pjVar1,&local_468,
               false,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    pjVar6 = o_local;
    pjVar1 = pjStack_28;
    psVar4 = err_local + 7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4b8,"max",&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4e0,"Accessor",&local_4e1);
    ParseNumberArrayProperty
              ((vector<double,_std::allocator<double>_> *)((long)&psVar4->field_2 + 8),
               (string *)pjVar6,pjVar1,&local_4b8,false,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    *(size_t *)((long)&err_local[1].field_2 + 8) = local_198;
    *(int *)err_local = local_2c;
    err_local[1]._M_string_length = local_98;
    err_local[1].field_2._M_local_buf[0] = local_e2 & 1;
    if ((local_140 < 0x1400) || (0x140a < local_140)) {
      std::__cxx11::stringstream::stringstream(local_670);
      poVar5 = std::operator<<(local_660,"Invalid `componentType` in accessor. Got ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_140);
      std::operator<<(poVar5,"\n");
      if (o_local != (json *)0x0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=
                  ((string *)o_local,(string *)&iterator.m_it.primitive_iterator);
        std::__cxx11::string::~string((string *)&iterator.m_it.primitive_iterator);
      }
      accessor_local._7_1_ = 0;
      local_258 = 1;
      std::__cxx11::stringstream::~stringstream(local_670);
    }
    else {
      *(int *)((long)&err_local[1].field_2 + 4) = (int)local_140;
      ParseExtrasProperty((Value *)&err_local[2]._M_string_length,pjStack_28);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)local_6b0);
      bVar2 = anon_unknown_57::FindMember
                        (pjStack_28,"sparse",
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)local_6b0);
      psVar4 = err_local;
      pjVar1 = o_local;
      if (bVar2) {
        pjVar6 = anon_unknown_57::GetValue((json_const_iterator *)local_6b0);
        accessor_local._7_1_ = ParseSparseAccessor((Accessor *)psVar4,(string *)pjVar1,pjVar6);
        local_258 = 1;
      }
      else {
        accessor_local._7_1_ = 1;
        local_258 = 1;
      }
    }
  }
  else {
    accessor_local._7_1_ = 0;
    local_258 = 1;
  }
LAB_00535d10:
  std::__cxx11::string::~string((string *)local_208);
LAB_00535d2c:
  return (bool)(accessor_local._7_1_ & 1);
}

Assistant:

static bool ParseAccessor(Accessor *accessor, std::string *err, const json &o) {
  int bufferView = -1;
  ParseIntegerProperty(&bufferView, err, o, "bufferView", false, "Accessor");

  size_t byteOffset = 0;
  ParseUnsignedProperty(&byteOffset, err, o, "byteOffset", false, "Accessor");

  bool normalized = false;
  ParseBooleanProperty(&normalized, err, o, "normalized", false, "Accessor");

  size_t componentType = 0;
  if (!ParseUnsignedProperty(&componentType, err, o, "componentType", true,
                             "Accessor")) {
    return false;
  }

  size_t count = 0;
  if (!ParseUnsignedProperty(&count, err, o, "count", true, "Accessor")) {
    return false;
  }

  std::string type;
  if (!ParseStringProperty(&type, err, o, "type", true, "Accessor")) {
    return false;
  }

  if (type.compare("SCALAR") == 0) {
    accessor->type = TINYGLTF_TYPE_SCALAR;
  } else if (type.compare("VEC2") == 0) {
    accessor->type = TINYGLTF_TYPE_VEC2;
  } else if (type.compare("VEC3") == 0) {
    accessor->type = TINYGLTF_TYPE_VEC3;
  } else if (type.compare("VEC4") == 0) {
    accessor->type = TINYGLTF_TYPE_VEC4;
  } else if (type.compare("MAT2") == 0) {
    accessor->type = TINYGLTF_TYPE_MAT2;
  } else if (type.compare("MAT3") == 0) {
    accessor->type = TINYGLTF_TYPE_MAT3;
  } else if (type.compare("MAT4") == 0) {
    accessor->type = TINYGLTF_TYPE_MAT4;
  } else {
    std::stringstream ss;
    ss << "Unsupported `type` for accessor object. Got \"" << type << "\"\n";
    if (err) {
      (*err) += ss.str();
    }
    return false;
  }

  ParseStringProperty(&accessor->name, err, o, "name", false);

  accessor->minValues.clear();
  accessor->maxValues.clear();
  ParseNumberArrayProperty(&accessor->minValues, err, o, "min", false,
                           "Accessor");

  ParseNumberArrayProperty(&accessor->maxValues, err, o, "max", false,
                           "Accessor");

  accessor->count = count;
  accessor->bufferView = bufferView;
  accessor->byteOffset = byteOffset;
  accessor->normalized = normalized;
  {
    if (componentType >= TINYGLTF_COMPONENT_TYPE_BYTE &&
        componentType <= TINYGLTF_COMPONENT_TYPE_DOUBLE) {
      // OK
      accessor->componentType = int(componentType);
    } else {
      std::stringstream ss;
      ss << "Invalid `componentType` in accessor. Got " << componentType
         << "\n";
      if (err) {
        (*err) += ss.str();
      }
      return false;
    }
  }

  ParseExtrasProperty(&(accessor->extras), o);

  // check if accessor has a "sparse" object:
  json_const_iterator iterator;
  if (FindMember(o, "sparse", iterator)) {
    // here this accessor has a "sparse" subobject
    return ParseSparseAccessor(accessor, err, GetValue(iterator));
  }

  return true;
}